

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O2

void resize_getline(gamewin *gw)

{
  WINDOW *pWVar1;
  int iVar2;
  int iVar3;
  
  pWVar1 = gw->win;
  if (pWVar1 == (WINDOW *)0x0) {
    iVar3 = -1;
    iVar2 = iVar3;
  }
  else {
    iVar3 = pWVar1->_maxx + 1;
    iVar2 = pWVar1->_maxy + 1;
  }
  if (_LINES <= iVar2) {
    iVar2 = _LINES;
  }
  if (_COLS <= iVar3) {
    iVar3 = _COLS;
  }
  mvwin(pWVar1,(long)(_LINES - iVar2) / 2 & 0xffffffff,(long)(_COLS - iVar3) / 2 & 0xffffffff);
  wresize(gw->win,iVar2,iVar3);
  return;
}

Assistant:

static void resize_getline(struct gamewin *gw)
{
    int height, width, startx, starty;
    
    getmaxyx(gw->win, height, width);
    if (height > LINES) height = LINES;
    if (width > COLS) width = COLS;
    
    starty = (LINES - height) / 2;
    startx = (COLS - width) / 2;
    
    mvwin(gw->win, starty, startx);
    wresize(gw->win, height, width);
}